

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O2

void intgemm::anon_unknown_0::TestMultiplyShiftNonShift<intgemm::AVX2::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  UnquantizeAndAddBiasAndWrite callback_01;
  float fVar1;
  ostream *poVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  float *pfVar8;
  ulong size;
  float *pfVar9;
  Index k;
  ulong uVar10;
  result_type_conflict rVar11;
  AlignedVector<float> A;
  AlignedVector<float> bias;
  AlignedVector<float> test_C;
  AlignedVector<float> B;
  AlignedVector<signed_char> B_prep;
  param_type local_15e8;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> A_prep_old;
  AlignedVector<unsigned_char> A_prep;
  undefined4 uStack_1594;
  undefined4 uStack_157c;
  undefined4 uStack_1564;
  string local_1550;
  ostringstream info;
  mt19937 gen;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&info);
  poVar2 = std::operator<<((ostream *)&info,"8-bit AVX2");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,'\t');
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,'\t');
  size = (ulong)B_cols;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  AlignedVector<float>::AlignedVector(&A,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&B,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&bias,size,0x40);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  pfVar3 = A.mem_;
  local_15e8._M_a = -1.0;
  local_15e8._M_b = 1.0;
  lVar6 = A.size_ << 2;
  for (lVar4 = 0; pfVar8 = B.mem_, lVar6 != lVar4; lVar4 = lVar4 + 4) {
    rVar11 = std::uniform_real_distribution<float>::operator()
                       ((uniform_real_distribution<float> *)&local_15e8,&gen);
    *(result_type_conflict *)((long)pfVar3 + lVar4) = rVar11;
  }
  lVar6 = B.size_ << 2;
  for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 4) {
    rVar11 = std::uniform_real_distribution<float>::operator()
                       ((uniform_real_distribution<float> *)&local_15e8,&gen);
    *(result_type_conflict *)((long)pfVar8 + lVar4) = rVar11;
  }
  for (lVar4 = 0; bias.size_ << 2 != lVar4; lVar4 = lVar4 + 4) {
    *(undefined4 *)((long)bias.mem_ + lVar4) = 0;
  }
  AlignedVector<unsigned_char>::AlignedVector(&A_prep,A.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&A_prep_old,A.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&B_prep,B.size_,0x40);
  AVX2::Kernels8::PrepareA(A.mem_,A_prep.mem_,63.5,A_rows,width);
  AVX2::Kernels8::PrepareA(A.mem_,A_prep_old.mem_,63.5,A_rows,width);
  AVX2::Kernels8::PrepareB(B.mem_,B_prep.mem_,63.5,width,B_cols);
  AlignedVector<float>::AlignedVector(&test_C,(ulong)(B_cols * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&slowint_C,test_C.size_,0x40);
  callback._4_4_ = uStack_1564;
  callback.unquant_mult = 0.0002480005;
  callback.bias_addr = bias.mem_;
  callback.output_addr = slowint_C.mem_;
  AVX2::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (A_prep_old.mem_,B_prep.mem_,A_rows,width,B_cols,callback);
  AlignedVector<float>::AlignedVector(&float_C,test_C.size_,0x40);
  pfVar3 = A.mem_;
  for (uVar7 = 0; uVar7 != A_rows; uVar7 = uVar7 + 1) {
    pfVar8 = B.mem_;
    for (uVar5 = 0; uVar5 != size; uVar5 = uVar5 + 1) {
      fVar1 = 0.0;
      pfVar9 = pfVar8;
      for (uVar10 = 0; width != uVar10; uVar10 = uVar10 + 1) {
        fVar1 = fVar1 + *pfVar9 * pfVar3[uVar10];
        pfVar9 = pfVar9 + size;
      }
      float_C.mem_[uVar7 * size + uVar5] = fVar1 + bias.mem_[uVar5];
      pfVar8 = pfVar8 + 1;
    }
    pfVar3 = pfVar3 + width;
  }
  callback_00._4_4_ = uStack_157c;
  callback_00.unquant_mult = -0.031496063;
  callback_00.bias_addr = bias.mem_;
  callback_00.output_addr = bias.mem_;
  AVX2::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (B_prep.mem_,width,B_cols,callback_00);
  callback_01._4_4_ = uStack_1594;
  callback_01.unquant_mult = 0.0002480005;
  callback_01.bias_addr = bias.mem_;
  callback_01.output_addr = test_C.mem_;
  AVX2::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (A_prep.mem_,B_prep.mem_,A_rows,width,B_cols,callback_01);
  pfVar9 = slowint_C.mem_;
  pfVar8 = float_C.mem_;
  pfVar3 = test_C.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar8,pfVar9,pfVar3,test_C.size_,&local_1550,int_tolerance,float_tolerance,
             MSE_float_tolerance,MSE_int_tolerance);
  std::__cxx11::string::~string((string *)&local_1550);
  free(float_C.mem_);
  free(slowint_C.mem_);
  free(test_C.mem_);
  free(B_prep.mem_);
  free(A_prep_old.mem_);
  free(A_prep.mem_);
  free(bias.mem_);
  free(B.mem_);
  free(A.mem_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&info);
  return;
}

Assistant:

void TestMultiplyShiftNonShift(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = 0;
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> A_prep_old(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareA(A.begin(), A_prep_old.begin(), quant_mult, A_rows, width); //Non shited version
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*
   * Reference non shift multiplication instead of slowint
   */
  AlignedVector<float> slowint_C(test_C.size());
  Routine::Multiply(A_prep_old.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), slowint_C.begin()));

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });

  /*
   * Multiply8 shift multiplication
   */
  float unquant_mult_forprep = (-1.0f)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}